

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

BinaryExpr * new_binary_expr(void *left,Token *op,void *right)

{
  void *any;
  BinaryExpr *pBVar1;
  TreeNode *pTVar2;
  BinaryExpr *expr;
  void *right_local;
  Token *op_local;
  void *left_local;
  
  any = malloc(0x20);
  pBVar1 = (BinaryExpr *)require_not_null(any,"Failed to allocate space");
  pTVar2 = new_tree_node(op,binary_eval);
  (pBVar1->node).eval = pTVar2->eval;
  (pBVar1->node).token = pTVar2->token;
  pBVar1->left = left;
  pBVar1->right = right;
  return pBVar1;
}

Assistant:

BinaryExpr *new_binary_expr(void *left, Token *op, void *right) {
    BinaryExpr *expr = new(BinaryExpr);
    expr->node = tree_node_(op, eval_handler(binary_eval));
    expr->left = left;
    expr->right = right;
    return expr;
}